

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall klogic::mlmvn::learn(mlmvn *this,cvector *X,cvector *errs,double learning_rate)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  const_iterator Xbeg;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  int k;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  
  calculate_errors(this,errs);
  mlmvn_forward_base::start(&this->calculator,X);
  do {
    uVar9 = (ulong)(this->calculator).layer;
    pvVar1 = (this->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar10 = pvVar1 + uVar9;
    pvVar3 = (this->errors).
             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Xbeg._M_current =
         (((this->calculator).from)->
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
         super__Vector_impl_data._M_start;
    sVar4 = (this->calculator).from_size;
    lVar8 = 0;
    lVar11 = 0;
    for (uVar7 = 0;
        lVar5 = *(long *)&(pvVar10->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                          _M_impl,
        uVar7 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar10->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl + 8) - lVar5 >> 5); uVar7 = uVar7 + 1) {
      mvn::learn((mvn *)(lVar5 + lVar11),Xbeg,Xbeg._M_current + sVar4,
                 (cmplx *)(*(long *)&pvVar3[uVar9].
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data + lVar8),learning_rate,
                 uVar9 < ((long)pvVar2 - (long)pvVar1) / 0x18 - 1U);
      lVar11 = lVar11 + 0x20;
      lVar8 = lVar8 + 0x10;
    }
    bVar6 = mlmvn_forward_base::step(&this->calculator);
  } while (!bVar6);
  return;
}

Assistant:

void klogic::mlmvn::learn(const klogic::cvector &X, const klogic::cvector &errs,
                          double learning_rate)
{
    // Calculate errors for all neurons (backward pass)
    calculate_errors(errs);

    // dump_errors();

    // Make a forward pass with error correction
    calculator.start(X);

    do {
        int layer = calculator.current_layer();

        // Divide by |z| for all layers except output
        bool variable_rate = layer < layers_count() - 1;

        vector<mvn>   &layer_neurons = neurons[layer];
        cvector const &layer_errors  = errors[layer];

        // Input for current layer
        cvector::const_iterator input_begin = calculator.input_begin(),
                                input_end   = calculator.input_end();

        // Learn current layer of neurons
//#pragma omp parallel
        {
//#pragma omp for
            for (int k = 0; k < layer_neurons.size(); ++k) {
                layer_neurons[k].learn(input_begin, input_end, layer_errors[k],
                                       learning_rate, variable_rate);
            }
        }
    } while (!calculator.step());

    // dump();
}